

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Analysis.cpp
# Opt level: O0

void __thiscall Analysis::FlowAnalysis_3D(Analysis *this)

{
  bool bVar1;
  void *pvVar2;
  ParameterReader *this_00;
  string *psVar3;
  string *in_RDI;
  double dVar4;
  shared_ptr<RandomUtil::Random> *in_stack_000000d8;
  string *in_stack_000000e0;
  ParameterReader *in_stack_000000e8;
  singleParticleSpectra *in_stack_000000f0;
  singleParticleSpectra **ipart_1;
  iterator __end1;
  iterator __begin1;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range1;
  int particle_monval;
  singleParticleSpectra **ipart;
  iterator __end2;
  iterator __begin2;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *__range2;
  int nev;
  int event_id;
  vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> spvn;
  ParameterReader paraRdr;
  undefined4 in_stack_fffffffffffff118;
  int in_stack_fffffffffffff11c;
  singleParticleSpectra *in_stack_fffffffffffff120;
  ParameterReader *in_stack_fffffffffffff128;
  allocator *paVar5;
  singleParticleSpectra *in_stack_fffffffffffff130;
  string *in_stack_fffffffffffff168;
  undefined4 in_stack_fffffffffffff170;
  undefined4 in_stack_fffffffffffff174;
  allocator *paVar6;
  string *in_stack_fffffffffffff238;
  allocator *in_stack_fffffffffffff240;
  double in_stack_fffffffffffff250;
  string *in_stack_fffffffffffff258;
  ParameterReader *in_stack_fffffffffffff260;
  __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
  local_be8;
  undefined1 *local_be0;
  allocator local_bd1;
  string local_bd0 [52];
  int local_b9c;
  reference local_b98;
  singleParticleSpectra **local_b90;
  __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
  local_b88;
  undefined1 *local_b80;
  allocator local_b71;
  string local_b70 [39];
  allocator local_b49;
  string local_b48 [32];
  int local_b28;
  allocator local_b21;
  string local_b20 [36];
  int local_afc;
  int local_af8;
  undefined1 local_af1;
  string local_ae0 [32];
  void *local_ac0;
  allocator local_ab1;
  string local_ab0 [39];
  undefined1 local_a89;
  string local_a78 [32];
  void *local_a58;
  allocator local_a49;
  string local_a48 [39];
  undefined1 local_a21;
  string local_a10 [32];
  void *local_9f0;
  allocator local_9e1;
  string local_9e0 [39];
  undefined1 local_9b9;
  string local_9a8 [32];
  void *local_988;
  allocator local_979;
  string local_978 [39];
  undefined1 local_951;
  string local_940 [16];
  shared_ptr<particleSamples> *in_stack_fffffffffffff6d0;
  singleParticleSpectra *in_stack_fffffffffffff6d8;
  allocator local_911;
  string local_910 [39];
  undefined1 local_8e9;
  string local_8d8 [32];
  void *local_8b8;
  allocator local_8a9;
  string local_8a8 [39];
  undefined1 local_881;
  string local_870 [32];
  string *local_850;
  allocator local_841;
  string local_840 [39];
  allocator local_819;
  string local_818 [39];
  undefined1 local_7f1;
  undefined1 local_7f0 [48];
  ParameterReader *local_7c0;
  allocator local_7b1;
  string local_7b0 [39];
  undefined1 local_789;
  string local_778 [32];
  void *local_758;
  allocator local_749;
  string local_748 [39];
  undefined1 local_721;
  string local_710 [32];
  void *local_6f0;
  allocator local_6e1;
  string local_6e0 [39];
  undefined1 local_6b9;
  string local_6a8 [32];
  void *local_688;
  allocator local_679;
  string local_678 [39];
  undefined1 local_651;
  string local_640 [32];
  void *local_620;
  allocator local_611;
  string local_610 [39];
  undefined1 local_5e9;
  string local_5d8 [32];
  void *local_5b8;
  allocator local_5a9;
  string local_5a8 [39];
  allocator local_581;
  string local_580 [39];
  allocator local_559;
  string local_558 [39];
  undefined1 local_531;
  string local_520 [32];
  void *local_500;
  allocator local_4f1;
  string local_4f0 [39];
  allocator local_4c9;
  string local_4c8 [39];
  allocator local_4a1;
  string local_4a0 [39];
  undefined1 local_479;
  string local_468 [32];
  void *local_448;
  allocator local_439;
  string local_438 [39];
  allocator local_411;
  string local_410 [39];
  undefined1 local_3e9;
  string local_3d8 [32];
  void *local_3b8;
  allocator local_3a9;
  string local_3a8 [39];
  allocator local_381;
  string local_380 [39];
  undefined1 local_359;
  string local_348 [32];
  void *local_328;
  allocator local_319;
  string local_318 [39];
  allocator local_2f1;
  string local_2f0 [39];
  allocator local_2c9;
  string local_2c8 [39];
  allocator local_2a1;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [39];
  allocator local_251;
  string local_250 [39];
  allocator local_229;
  string local_228 [39];
  allocator local_201;
  string local_200 [39];
  undefined1 local_1d9;
  string local_1c8 [32];
  void *local_1a8;
  allocator local_199;
  string local_198 [39];
  allocator local_171;
  string local_170 [39];
  allocator local_149;
  string local_148 [39];
  allocator local_121;
  string local_120 [39];
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  undefined1 local_b0 [31];
  allocator local_91;
  string local_90 [55];
  allocator local_59;
  string local_58 [88];
  
  ParameterReader::ParameterReader
            ((ParameterReader *)in_stack_fffffffffffff130,in_stack_fffffffffffff128);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_58,"compute_correlation",&local_59);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"flag_charge_dependence",&local_91);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x19878b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"particle_monval",&local_d1);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"rap_type",&local_f9);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_120,"rapidity_distribution",&local_121);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_120);
  std::allocator<char>::~allocator((allocator<char> *)&local_121);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_148,"vn_rapidity_dis_pT_min",&local_149);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator((allocator<char> *)&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_170,"vn_rapidity_dis_pT_max",&local_171);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_170);
  std::allocator<char>::~allocator((allocator<char> *)&local_171);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_198,"rapidityPTDistributionFlag",&local_199);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator((allocator<char> *)&local_199);
  pvVar2 = operator_new(0x8b8);
  local_1d9 = 1;
  std::__cxx11::string::string(local_1c8,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_1d9 = 0;
  local_1a8 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x198ac0);
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,"particle_monval",&local_201);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_228,"rap_type",&local_229);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_228);
  std::allocator<char>::~allocator((allocator<char> *)&local_229);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_250,"rapidity_distribution",&local_251);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_250);
  std::allocator<char>::~allocator((allocator<char> *)&local_251);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_278,"vn_rapidity_dis_pT_min",&local_279);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_278);
  std::allocator<char>::~allocator((allocator<char> *)&local_279);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2a0,"vn_rapidity_dis_pT_max",&local_2a1);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_2a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2c8,"rapidityPTDistributionFlag",&local_2c9);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_2c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_2f0,"rap_min",&local_2f1);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_2f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_318,"rap_max",&local_319);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_318);
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  pvVar2 = operator_new(0x8b8);
  local_359 = 1;
  std::__cxx11::string::string(local_348,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_359 = 0;
  local_328 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x198eda);
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"rap_min",&local_381);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_3a8,"rap_max",&local_3a9);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_3a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_3a9);
  pvVar2 = operator_new(0x8b8);
  local_3e9 = 1;
  std::__cxx11::string::string(local_3d8,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_3e9 = 0;
  local_3b8 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x199076);
  std::__cxx11::string::~string(local_3d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_410,"rap_min",&local_411);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_410);
  std::allocator<char>::~allocator((allocator<char> *)&local_411);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_438,"rap_max",&local_439);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_438);
  std::allocator<char>::~allocator((allocator<char> *)&local_439);
  pvVar2 = operator_new(0x8b8);
  local_479 = 1;
  std::__cxx11::string::string(local_468,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_479 = 0;
  local_448 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x199212);
  std::__cxx11::string::~string(local_468);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4a0,"rap_min",&local_4a1);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_4a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4c8,"rap_max",&local_4c9);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_4f0,"rapidityPTDistributionFlag",&local_4f1);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_4f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_4f1);
  pvVar2 = operator_new(0x8b8);
  local_531 = 1;
  std::__cxx11::string::string(local_520,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_531 = 0;
  local_500 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19941a);
  std::__cxx11::string::~string(local_520);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_558,"rap_type",&local_559);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_580,"rapidityPTDistributionFlag",&local_581);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_580);
  std::allocator<char>::~allocator((allocator<char> *)&local_581);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_5a8,"particle_monval",&local_5a9);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_5a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_5a9);
  pvVar2 = operator_new(0x8b8);
  local_5e9 = 1;
  std::__cxx11::string::string(local_5d8,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_5e9 = 0;
  local_5b8 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19961d);
  std::__cxx11::string::~string(local_5d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_610,"particle_monval",&local_611);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_610);
  std::allocator<char>::~allocator((allocator<char> *)&local_611);
  pvVar2 = operator_new(0x8b8);
  local_651 = 1;
  std::__cxx11::string::string(local_640,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_651 = 0;
  local_620 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19974d);
  std::__cxx11::string::~string(local_640);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_678,"particle_monval",&local_679);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_678);
  std::allocator<char>::~allocator((allocator<char> *)&local_679);
  pvVar2 = operator_new(0x8b8);
  local_6b9 = 1;
  std::__cxx11::string::string(local_6a8,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_6b9 = 0;
  local_688 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19987d);
  std::__cxx11::string::~string(local_6a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6e0,"particle_monval",&local_6e1);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_6e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6e1);
  pvVar2 = operator_new(0x8b8);
  local_721 = 1;
  std::__cxx11::string::string(local_710,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_721 = 0;
  local_6f0 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x1999ad);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_748,"particle_monval",&local_749);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_748);
  std::allocator<char>::~allocator((allocator<char> *)&local_749);
  pvVar2 = operator_new(0x8b8);
  local_789 = 1;
  std::__cxx11::string::string(local_778,in_RDI);
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_789 = 0;
  local_758 = pvVar2;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x199add);
  std::__cxx11::string::~string(local_778);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_7b0,"particle_monval",&local_7b1);
  ParameterReader::setVal
            (in_stack_fffffffffffff260,in_stack_fffffffffffff258,in_stack_fffffffffffff250);
  std::__cxx11::string::~string(local_7b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_7b1);
  this_00 = (ParameterReader *)operator_new(0x8b8);
  local_7f1 = 1;
  std::__cxx11::string::string((string *)(local_7f0 + 0x10),in_RDI);
  psVar3 = (string *)local_7f0;
  std::shared_ptr<RandomUtil::Random>::shared_ptr
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  singleParticleSpectra::singleParticleSpectra
            (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
  local_7f1 = 0;
  local_7c0 = this_00;
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff120,
             (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x199c0d);
  std::__cxx11::string::~string((string *)(local_7f0 + 0x10));
  paVar6 = &local_819;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_818,"resonance_weak_feed_down_flag",paVar6);
  dVar4 = ParameterReader::getVal
                    ((ParameterReader *)
                     CONCAT44(in_stack_fffffffffffff174,in_stack_fffffffffffff170),
                     in_stack_fffffffffffff168);
  std::__cxx11::string::~string(local_818);
  std::allocator<char>::~allocator((allocator<char> *)&local_819);
  if ((dVar4 == 0.0) && (!NAN(dVar4))) {
    in_stack_fffffffffffff240 = &local_841;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_840,"particle_monval",in_stack_fffffffffffff240);
    ParameterReader::setVal(this_00,psVar3,(double)paVar6);
    std::__cxx11::string::~string(local_840);
    std::allocator<char>::~allocator((allocator<char> *)&local_841);
    in_stack_fffffffffffff238 = (string *)operator_new(0x8b8);
    local_881 = 1;
    std::__cxx11::string::string(local_870,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    singleParticleSpectra::singleParticleSpectra
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_881 = 0;
    local_850 = in_stack_fffffffffffff238;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_fffffffffffff120,
               (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x199dc6);
    std::__cxx11::string::~string(local_870);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_8a8,"particle_monval",&local_8a9);
    ParameterReader::setVal(this_00,psVar3,(double)paVar6);
    std::__cxx11::string::~string(local_8a8);
    std::allocator<char>::~allocator((allocator<char> *)&local_8a9);
    pvVar2 = operator_new(0x8b8);
    local_8e9 = 1;
    std::__cxx11::string::string(local_8d8,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    singleParticleSpectra::singleParticleSpectra
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_8e9 = 0;
    local_8b8 = pvVar2;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_fffffffffffff120,
               (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x199ef6);
    std::__cxx11::string::~string(local_8d8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_910,"particle_monval",&local_911);
    ParameterReader::setVal(this_00,psVar3,(double)paVar6);
    std::__cxx11::string::~string(local_910);
    std::allocator<char>::~allocator((allocator<char> *)&local_911);
    operator_new(0x8b8);
    local_951 = 1;
    std::__cxx11::string::string(local_940,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    singleParticleSpectra::singleParticleSpectra
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_951 = 0;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_fffffffffffff120,
               (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19a026);
    std::__cxx11::string::~string(local_940);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_978,"particle_monval",&local_979);
    ParameterReader::setVal(this_00,psVar3,(double)paVar6);
    std::__cxx11::string::~string(local_978);
    std::allocator<char>::~allocator((allocator<char> *)&local_979);
    pvVar2 = operator_new(0x8b8);
    local_9b9 = 1;
    std::__cxx11::string::string(local_9a8,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    singleParticleSpectra::singleParticleSpectra
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_9b9 = 0;
    local_988 = pvVar2;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_fffffffffffff120,
               (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19a156);
    std::__cxx11::string::~string(local_9a8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_9e0,"particle_monval",&local_9e1);
    ParameterReader::setVal(this_00,psVar3,(double)paVar6);
    std::__cxx11::string::~string(local_9e0);
    std::allocator<char>::~allocator((allocator<char> *)&local_9e1);
    pvVar2 = operator_new(0x8b8);
    local_a21 = 1;
    std::__cxx11::string::string(local_a10,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    singleParticleSpectra::singleParticleSpectra
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_a21 = 0;
    local_9f0 = pvVar2;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_fffffffffffff120,
               (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19a286);
    std::__cxx11::string::~string(local_a10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_a48,"particle_monval",&local_a49);
    ParameterReader::setVal(this_00,psVar3,(double)paVar6);
    std::__cxx11::string::~string(local_a48);
    std::allocator<char>::~allocator((allocator<char> *)&local_a49);
    pvVar2 = operator_new(0x8b8);
    local_a89 = 1;
    std::__cxx11::string::string(local_a78,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    singleParticleSpectra::singleParticleSpectra
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_a89 = 0;
    local_a58 = pvVar2;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_fffffffffffff120,
               (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19a3b6);
    std::__cxx11::string::~string(local_a78);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_ab0,"particle_monval",&local_ab1);
    ParameterReader::setVal(this_00,psVar3,(double)paVar6);
    std::__cxx11::string::~string(local_ab0);
    std::allocator<char>::~allocator((allocator<char> *)&local_ab1);
    pvVar2 = operator_new(0x8b8);
    local_af1 = 1;
    std::__cxx11::string::string(local_ae0,in_RDI);
    std::shared_ptr<RandomUtil::Random>::shared_ptr
              ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffff120,
               (shared_ptr<RandomUtil::Random> *)
               CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    singleParticleSpectra::singleParticleSpectra
              (in_stack_000000f0,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    local_af1 = 0;
    local_ac0 = pvVar2;
    std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::push_back
              ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
               in_stack_fffffffffffff120,
               (value_type *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::shared_ptr<RandomUtil::Random>::~shared_ptr((shared_ptr<RandomUtil::Random> *)0x19a4e6);
    std::__cxx11::string::~string(local_ae0);
  }
  local_af8 = 0;
  while( true ) {
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19b730);
    bVar1 = particleSamples::end_of_file
                      ((particleSamples *)
                       CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff120,
               (char (*) [16])CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    local_afc = local_af8 + 1;
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff120,
               (int *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff120,
               (char (*) [6])CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    psVar3 = (string *)(in_RDI + 0x70);
    paVar6 = &local_b21;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b20,"info",paVar6);
    pretty_ostream::flush((pretty_ostream *)in_stack_fffffffffffff240,in_stack_fffffffffffff238);
    std::__cxx11::string::~string(local_b20);
    std::allocator<char>::~allocator((allocator<char> *)&local_b21);
    std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x19b82b);
    local_b28 = particleSamples::read_in_particle_samples
                          ((particleSamples *)in_stack_fffffffffffff120);
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff120,
               (char (*) [7])CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    pretty_ostream::operator<<
              ((pretty_ostream *)in_stack_fffffffffffff120,
               (int *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b48,"info",&local_b49);
    pretty_ostream::flush((pretty_ostream *)in_stack_fffffffffffff240,in_stack_fffffffffffff238);
    std::__cxx11::string::~string(local_b48);
    std::allocator<char>::~allocator((allocator<char> *)&local_b49);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b70," processing ...",&local_b71);
    pretty_ostream::info((pretty_ostream *)paVar6,psVar3);
    std::__cxx11::string::~string(local_b70);
    std::allocator<char>::~allocator((allocator<char> *)&local_b71);
    local_b80 = local_b0;
    local_b88._M_current =
         (singleParticleSpectra **)
         std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::begin
                   ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                    CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    local_b90 = (singleParticleSpectra **)
                std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::end
                          ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>
                            *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    while( true ) {
      bVar1 = __gnu_cxx::operator!=
                        ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)in_stack_fffffffffffff120,
                         (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                          *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      if (!bVar1) break;
      local_b98 = __gnu_cxx::
                  __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                  ::operator*(&local_b88);
      local_b9c = singleParticleSpectra::get_monval(*local_b98);
      std::__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<particleSamples,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x19b9ee);
      particleSamples::filter_particles_from_events
                ((particleSamples *)in_stack_fffffffffffff120,in_stack_fffffffffffff11c);
      in_stack_fffffffffffff130 = *local_b98;
      std::shared_ptr<particleSamples>::shared_ptr
                ((shared_ptr<particleSamples> *)in_stack_fffffffffffff120,
                 (shared_ptr<particleSamples> *)
                 CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
      singleParticleSpectra::calculate_Qn_vector_shell
                (in_stack_fffffffffffff6d8,in_stack_fffffffffffff6d0);
      std::shared_ptr<particleSamples>::~shared_ptr((shared_ptr<particleSamples> *)0x19ba4b);
      __gnu_cxx::
      __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
      ::operator++(&local_b88);
    }
    in_stack_fffffffffffff120 = (singleParticleSpectra *)(in_RDI + 0x70);
    paVar5 = &local_bd1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_bd0,"done!",paVar5);
    pretty_ostream::info((pretty_ostream *)paVar6,psVar3);
    std::__cxx11::string::~string(local_bd0);
    std::allocator<char>::~allocator((allocator<char> *)&local_bd1);
    local_af8 = local_b28 + local_af8;
  }
  local_be0 = local_b0;
  local_be8._M_current =
       (singleParticleSpectra **)
       std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::begin
                 ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
                  CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::end
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)in_stack_fffffffffffff120,
                       (__normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
                        *)CONCAT44(in_stack_fffffffffffff11c,in_stack_fffffffffffff118));
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator*(&local_be8);
    singleParticleSpectra::output_spectra_and_Qn_results(in_stack_fffffffffffff120);
    __gnu_cxx::
    __normal_iterator<singleParticleSpectra_**,_std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>_>
    ::operator++(&local_be8);
  }
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::clear
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)0x19bcc7);
  std::vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_>::~vector
            ((vector<singleParticleSpectra_*,_std::allocator<singleParticleSpectra_*>_> *)
             in_stack_fffffffffffff130);
  ParameterReader::~ParameterReader((ParameterReader *)in_stack_fffffffffffff120);
  return;
}

Assistant:

void Analysis::FlowAnalysis_3D() {
    ParameterReader paraRdr = paraRdr_;
    paraRdr.setVal("compute_correlation", 0);
    paraRdr.setVal("flag_charge_dependence", 0);

    // first define all the analysis sets
    std::vector<singleParticleSpectra *> spvn;

    // all hadrons (99999) first (collect E_T)
    paraRdr.setVal("particle_monval", 99999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 4.);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // charged hadron first
    paraRdr.setVal("particle_monval", 9999);
    paraRdr.setVal("rap_type", 0);
    paraRdr.setVal("rapidity_distribution", 1);
    paraRdr.setVal("vn_rapidity_dis_pT_min", 0.2);
    paraRdr.setVal("vn_rapidity_dis_pT_max", 3.0);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", 0.5);
    paraRdr.setVal("rap_max", 2.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -2.5);
    paraRdr.setVal("rap_max", -0.5);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("rap_min", -0.5);
    paraRdr.setVal("rap_max", 0.5);
    paraRdr.setVal("rapidityPTDistributionFlag", 1);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));

    // now identified particle
    paraRdr.setVal("rap_type", 1);
    paraRdr.setVal("rapidityPTDistributionFlag", 0);
    paraRdr.setVal("particle_monval", 211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -211);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -321);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", 2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    paraRdr.setVal("particle_monval", -2212);
    spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    if (paraRdr.getVal("resonance_weak_feed_down_flag") == 0) {
        paraRdr.setVal("particle_monval", 3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3122);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3312);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", -3334);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
        paraRdr.setVal("particle_monval", 333);
        spvn.push_back(new singleParticleSpectra(paraRdr, path_, ran_gen_ptr_));
    }

    // start the loop
    int event_id = 0;
    while (!particle_list_->end_of_file()) {
        messager << "Reading event: " << event_id + 1 << " ... ";
        messager.flush("info");
        int nev = particle_list_->read_in_particle_samples();
        messager << "nev = " << nev;
        messager.flush("info");
        messager.info(" processing ...");
        for (auto &ipart : spvn) {
            int particle_monval = ipart->get_monval();
            particle_list_->filter_particles_from_events(particle_monval);
            ipart->calculate_Qn_vector_shell(particle_list_);
        }
        messager.info("done!");
        event_id += nev;
    }
    for (auto &ipart : spvn) ipart->output_spectra_and_Qn_results();
    spvn.clear();
}